

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O1

void glslang::BuiltInVariable
               (char *blockName,char *name,TBuiltInVariable builtIn,TSymbolTable *symbolTable)

{
  char cVar1;
  int iVar2;
  TSymbol *pTVar3;
  undefined4 extraout_var;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this;
  long lVar6;
  long lVar7;
  long lVar8;
  pool_allocator<char> local_58;
  TString local_50;
  long *plVar4;
  
  local_58.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_50,
             blockName,&local_58);
  pTVar3 = TSymbolTable::find(symbolTable,&local_50,(bool *)0x0,(bool *)0x0,(int *)0x0);
  if (pTVar3 != (TSymbol *)0x0) {
    iVar2 = (*pTVar3->_vptr_TSymbol[0xd])(pTVar3);
    plVar4 = (long *)CONCAT44(extraout_var,iVar2);
    cVar1 = (**(code **)(*plVar4 + 0x128))(plVar4);
    if (cVar1 == '\0') {
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9e1,"TTypeList *glslang::TType::getWritableStruct() const");
    }
    lVar6 = plVar4[0xd];
    lVar5 = *(long *)(lVar6 + 8);
    if (0 < (int)((ulong)(*(long *)(lVar6 + 0x10) - lVar5) >> 5)) {
      lVar7 = 0;
      lVar8 = 0;
      do {
        this = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               (**(code **)(**(long **)(lVar5 + lVar7) + 0x30))();
        iVar2 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (this,name);
        if (iVar2 == 0) {
          lVar6 = (**(code **)(**(long **)(*(long *)(lVar6 + 8) + lVar7) + 0x50))();
          *(ulong *)(lVar6 + 8) =
               *(ulong *)(lVar6 + 8) & 0xffffffffffff007f | (ulong)((builtIn & 0x1ff) << 7);
          return;
        }
        lVar8 = lVar8 + 1;
        lVar5 = *(long *)(lVar6 + 8);
        lVar7 = lVar7 + 0x20;
      } while (lVar8 < (int)((ulong)(*(long *)(lVar6 + 0x10) - lVar5) >> 5));
    }
  }
  return;
}

Assistant:

static void BuiltInVariable(const char* blockName, const char* name, TBuiltInVariable builtIn, TSymbolTable& symbolTable)
{
    TSymbol* symbol = symbolTable.find(blockName);
    if (symbol == nullptr)
        return;

    TTypeList& structure = *symbol->getWritableType().getWritableStruct();
    for (int i = 0; i < (int)structure.size(); ++i) {
        if (structure[i].type->getFieldName().compare(name) == 0) {
            structure[i].type->getQualifier().builtIn = builtIn;
            return;
        }
    }
}